

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  size_t sVar4;
  ma_uint64 mVar5;
  ma_uint32 *pmVar6;
  uint uVar7;
  int iVar8;
  ma_uint32 *pmVar9;
  ma_int32 *pmVar10;
  int iVar11;
  ma_uint32 *pmVar12;
  ma_uint32 mVar13;
  ma_uint32 *pmVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ma_int32 mVar19;
  ma_uint64 mVar20;
  int iVar21;
  uint uVar22;
  ma_uint32 *unaff_R15;
  ulong uVar23;
  ma_uint8 header [4];
  byte local_80 [4];
  byte local_7c;
  byte local_7b;
  byte local_7a;
  ma_uint32 *local_78;
  ma_uint32 *local_70;
  ma_uint64 local_68;
  ma_int16 *local_60;
  ma_uint32 *local_58;
  ma_uint32 *local_50;
  ma_int32 *local_48;
  undefined8 local_40;
  ma_uint64 local_38;
  
  if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
    return 0;
  }
  pmVar14 = &(pWav->ima).cachedFrameCount;
  local_48 = (pWav->ima).cachedFrames;
  pmVar9 = (ma_uint32 *)0x0;
  do {
    local_78 = unaff_R15;
    if ((*pmVar14 == 0) && ((pWav->ima).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar4 = (*pWav->onRead)(pWav->pUserData,local_80,4);
        if (sVar4 == 4) {
          mVar13 = (pWav->fmt).blockAlign - 4;
          (pWav->ima).bytesRemainingInBlock = mVar13;
          if (local_80[2] < 0x59) {
            uVar7 = (int)(short)((ushort)local_80[1] << 8) | (uint)local_80[0];
            (pWav->ima).predictor[0] = uVar7;
            (pWav->ima).stepIndex[0] = (uint)local_80[2];
            goto LAB_00154efc;
          }
LAB_00154e97:
          (*pWav->onSeek)(pWav->pUserData,mVar13,ma_dr_wav_seek_origin_current);
          (pWav->ima).bytesRemainingInBlock = 0;
        }
LAB_00154ead:
        bVar3 = false;
        local_78 = pmVar9;
      }
      else {
        sVar4 = (*pWav->onRead)(pWav->pUserData,local_80,8);
        if (sVar4 != 8) goto LAB_00154ead;
        mVar13 = (pWav->fmt).blockAlign - 8;
        (pWav->ima).bytesRemainingInBlock = mVar13;
        if (0x58 < local_7a || 0x58 < local_80[2]) goto LAB_00154e97;
        uVar17 = (int)(short)((ushort)local_80[1] << 8) | (uint)local_80[0];
        (pWav->ima).predictor[0] = uVar17;
        (pWav->ima).stepIndex[0] = (uint)local_80[2];
        uVar7 = (int)(short)((ushort)local_7b << 8) | (uint)local_7c;
        (pWav->ima).predictor[1] = uVar7;
        (pWav->ima).stepIndex[1] = (uint)local_7a;
        (pWav->ima).cachedFrames[0xe] = uVar17;
LAB_00154efc:
        (pWav->ima).cachedFrames[0xf] = uVar7;
        (pWav->ima).cachedFrameCount = 1;
        bVar3 = true;
      }
      if (!bVar3) {
        return (ma_uint64)local_78;
      }
    }
    if (framesToRead == 0) {
      return (ma_uint64)pmVar9;
    }
    uVar23 = (ulong)*pmVar14;
    mVar5 = framesToRead - uVar23;
    pmVar6 = (ma_uint32 *)(uVar23 + (long)pmVar9);
    pmVar12 = pmVar9;
    mVar20 = framesToRead;
    while( true ) {
      iVar8 = (int)uVar23;
      local_70 = pmVar9;
      local_68 = framesToRead;
      if (iVar8 == 0) break;
      uVar23 = pWav->readCursorInPCMFrames;
      if (pWav->totalPCMFrameCount <= uVar23) {
        pmVar6 = pmVar12;
        mVar5 = mVar20;
        if (iVar8 != 0) goto LAB_00155274;
        break;
      }
      if (pBufferOut == (ma_int16 *)0x0) {
        pBufferOut = (ma_int16 *)0x0;
      }
      else {
        uVar18 = (ulong)pWav->channels;
        if (pWav->channels != 0) {
          uVar15 = 0;
          do {
            pBufferOut[uVar15] = (ma_int16)pmVar14[uVar15 - (uint)((int)uVar18 * iVar8)];
            uVar15 = uVar15 + 1;
            uVar18 = (ulong)pWav->channels;
          } while (uVar15 < uVar18);
        }
        pBufferOut = pBufferOut + uVar18;
      }
      pmVar12 = (ma_uint32 *)((long)pmVar12 + 1);
      pWav->readCursorInPCMFrames = uVar23 + 1;
      (pWav->ima).cachedFrameCount = iVar8 - 1U;
      uVar23 = (ulong)(iVar8 - 1U);
      mVar20 = mVar20 - 1;
      if (mVar20 == 0) {
        return framesToRead + (long)pmVar9;
      }
    }
    pmVar12 = pmVar6;
    mVar20 = mVar5;
    if (((pWav->ima).bytesRemainingInBlock != 0) &&
       ((pWav->ima).cachedFrameCount = 8, pWav->channels != 0)) {
      local_68 = 0x10;
      uVar23 = 0;
      local_70 = pmVar14;
      local_60 = pBufferOut;
      local_58 = pmVar6;
      local_50 = pmVar14;
      local_38 = mVar5;
      do {
        sVar4 = (*pWav->onRead)(pWav->pUserData,local_80,4);
        if (sVar4 == 4) {
          (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
          uVar2 = pWav->channels;
          pmVar10 = local_48 + uVar2 + local_68;
          lVar16 = 0;
          pmVar14 = local_70;
          do {
            bVar1 = local_80[lVar16];
            uVar22 = (uint)bVar1;
            uVar17 = uVar22 & 0xf;
            iVar8 = (pWav->ima).stepIndex[uVar23];
            uVar7 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar8];
            iVar21 = ((int)(uVar17 << 0x1d) >> 0x1f & uVar7) +
                     ((int)uVar7 >> 1 & (int)(uVar17 << 0x1e) >> 0x1f) +
                     ((int)uVar7 >> 2 & -(uVar22 & 1)) + ((int)uVar7 >> 3);
            iVar11 = -iVar21;
            if ((byte)uVar17 < 8) {
              iVar11 = iVar21;
            }
            uVar7 = iVar11 + (pWav->ima).predictor[uVar23];
            if (0x7ffe < (int)uVar7) {
              uVar7 = 0x7fff;
            }
            if ((int)uVar7 < -0x7fff) {
              uVar7 = 0xffff8000;
            }
            (pWav->ima).predictor[uVar23] = uVar7;
            mVar19 = iVar8 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[uVar17];
            if (0x57 < mVar19) {
              mVar19 = 0x58;
            }
            if (mVar19 < 1) {
              mVar19 = 0;
            }
            (pWav->ima).stepIndex[uVar23] = mVar19;
            pmVar14[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = uVar7;
            iVar8 = (pWav->ima).stepIndex[uVar23];
            uVar7 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar8];
            iVar21 = ((int)(uVar22 << 0x19) >> 0x1f & uVar7) + ((int)uVar7 >> 3) +
                     ((int)uVar7 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                     ((int)uVar7 >> 1 & (int)(uVar22 << 0x1a) >> 0x1f);
            iVar11 = -iVar21;
            if (-1 < (char)bVar1) {
              iVar11 = iVar21;
            }
            iVar11 = iVar11 + (pWav->ima).predictor[uVar23];
            if (0x7ffe < iVar11) {
              iVar11 = 0x7fff;
            }
            if (iVar11 < -0x7fff) {
              iVar11 = -0x8000;
            }
            (pWav->ima).predictor[uVar23] = iVar11;
            mVar19 = iVar8 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar1 >> 4];
            if (0x57 < mVar19) {
              mVar19 = 0x58;
            }
            if (mVar19 < 1) {
              mVar19 = 0;
            }
            (pWav->ima).stepIndex[uVar23] = mVar19;
            pmVar10[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = iVar11;
            lVar16 = lVar16 + 1;
            pmVar10 = (ma_int32 *)((long)pmVar10 + (ulong)((uint)uVar2 * 8));
            pmVar14 = (ma_uint32 *)((long)pmVar14 + (ulong)((uint)uVar2 * 8));
          } while (lVar16 != 4);
          local_40 = 4;
          pmVar6 = local_58;
          pmVar14 = local_50;
        }
        else {
          *pmVar14 = 0;
          local_78 = pmVar6;
        }
        if (sVar4 != 4) {
          return (ma_uint64)local_78;
        }
        uVar23 = uVar23 + 1;
        local_68 = local_68 + 1;
        local_70 = local_70 + 1;
        pmVar12 = pmVar6;
        mVar20 = local_38;
        pBufferOut = local_60;
      } while (uVar23 < pWav->channels);
    }
LAB_00155274:
    pmVar9 = pmVar12;
    framesToRead = mVar20;
    unaff_R15 = local_78;
    if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
      return (ma_uint64)pmVar9;
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint32 iChannel;
    static ma_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };
    static ma_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17,
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45,
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118,
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066,
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899,
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767
    };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = (ma_int16)ma_dr_wav_bytes_to_u16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                ma_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable) || header[6] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = ma_dr_wav_bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.predictor[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = ma_dr_wav_clamp(header[6], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->ima.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    ma_uint32 iByte;
                    ma_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;
                    for (iByte = 0; iByte < 4; ++iByte) {
                        ma_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        ma_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);
                        ma_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        ma_int32 predictor = pWav->ima.predictor[iChannel];
                        ma_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;
                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];
                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }
    return totalFramesRead;
}